

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Performance::InvalidShaderCompilerCase::logProgramData
          (InvalidShaderCompilerCase *this,BuildInfo *buildInfo,ProgramContext *progCtx)

{
  TestLog *this_00;
  long *local_110 [2];
  long local_100 [2];
  long *local_f0;
  long local_e8;
  long local_e0 [2];
  LogShader local_d0;
  LogShader local_80;
  
  this_00 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"(No linking done)","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char*>((string *)local_110,local_f0,local_e8 + (long)local_f0);
  tcu::TestLog::startShaderProgram(this_00,false,(char *)local_110[0]);
  tcu::LogShader::LogShader
            (&local_80,QP_SHADER_TYPE_VERTEX,&progCtx->vertShaderSource,
             buildInfo->vertCompileSuccess,&(buildInfo->logs).vert);
  tcu::TestLog::writeShader
            (this_00,local_80.m_type,local_80.m_source._M_dataplus._M_p,local_80.m_compileOk,
             local_80.m_infoLog._M_dataplus._M_p);
  tcu::LogShader::LogShader
            (&local_d0,QP_SHADER_TYPE_FRAGMENT,&progCtx->fragShaderSource,
             buildInfo->fragCompileSuccess,&(buildInfo->logs).frag);
  tcu::TestLog::writeShader
            (this_00,local_d0.m_type,local_d0.m_source._M_dataplus._M_p,local_d0.m_compileOk,
             local_d0.m_infoLog._M_dataplus._M_p);
  tcu::TestLog::endShaderProgram(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_infoLog._M_dataplus._M_p != &local_d0.m_infoLog.field_2) {
    operator_delete(local_d0.m_infoLog._M_dataplus._M_p,
                    local_d0.m_infoLog.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_source._M_dataplus._M_p != &local_d0.m_source.field_2) {
    operator_delete(local_d0.m_source._M_dataplus._M_p,
                    local_d0.m_source.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_infoLog._M_dataplus._M_p != &local_80.m_infoLog.field_2) {
    operator_delete(local_80.m_infoLog._M_dataplus._M_p,
                    local_80.m_infoLog.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_source._M_dataplus._M_p != &local_80.m_source.field_2) {
    operator_delete(local_80.m_source._M_dataplus._M_p,
                    local_80.m_source.field_2._M_allocated_capacity + 1);
  }
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  return;
}

Assistant:

void InvalidShaderCompilerCase::logProgramData (const BuildInfo& buildInfo, const ProgramContext& progCtx) const
{
	m_testCtx.getLog() << TestLog::ShaderProgram(false, "(No linking done)")
					   << TestLog::Shader(QP_SHADER_TYPE_VERTEX,	progCtx.vertShaderSource, buildInfo.vertCompileSuccess, buildInfo.logs.vert)
					   << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT,	progCtx.fragShaderSource, buildInfo.fragCompileSuccess, buildInfo.logs.frag)
					   << TestLog::EndShaderProgram;
}